

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

void ffcdsp(char *tform,char *cform)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  
  *cform = '\0';
  for (; *tform == ' '; tform = tform + 1) {
  }
  if (*tform == '\0') {
    return;
  }
  pcVar2 = strchr(tform,0x25);
  if (pcVar2 != (char *)0x0) {
    return;
  }
  *cform = '%';
  strcpy(cform + 1,tform + 1);
  cVar1 = *tform;
  switch(cVar1) {
  case 'A':
switchD_00177a88_caseD_61:
    sVar3 = strlen(cform);
    (cform + sVar3)[0] = 's';
    (cform + sVar3)[1] = '\0';
    break;
  case 'D':
  case 'E':
switchD_00177a88_caseD_64:
    sVar3 = strlen(cform);
    (cform + sVar3)[0] = 'E';
    (cform + sVar3)[1] = '\0';
    return;
  case 'F':
switchD_00177a88_caseD_66:
    sVar3 = strlen(cform);
    (cform + sVar3)[0] = 'f';
    (cform + sVar3)[1] = '\0';
    return;
  case 'G':
switchD_00177a88_caseD_67:
    sVar3 = strlen(cform);
    (cform + sVar3)[0] = 'G';
    (cform + sVar3)[1] = '\0';
    return;
  case 'I':
switchD_00177a88_caseD_69:
    sVar3 = strlen(cform);
    (cform + sVar3)[0] = 'd';
    (cform + sVar3)[1] = '\0';
    return;
  case 'O':
switchD_00177a88_caseD_6f:
    sVar3 = strlen(cform);
    (cform + sVar3)[0] = 'o';
    (cform + sVar3)[1] = '\0';
    return;
  default:
    switch(cVar1) {
    case 'a':
      goto switchD_00177a88_caseD_61;
    case 'b':
    case 'c':
    case 'h':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
      break;
    case 'd':
    case 'e':
      goto switchD_00177a88_caseD_64;
    case 'f':
      goto switchD_00177a88_caseD_66;
    case 'g':
      goto switchD_00177a88_caseD_67;
    case 'i':
      goto switchD_00177a88_caseD_69;
    case 'o':
      goto switchD_00177a88_caseD_6f;
    default:
      if ((cVar1 == 'Z') || (cVar1 == 'z')) {
        sVar3 = strlen(cform);
        (cform + sVar3)[0] = 'X';
        (cform + sVar3)[1] = '\0';
        return;
      }
    }
  case 'B':
  case 'C':
  case 'H':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
    *cform = '\0';
  }
  return;
}

Assistant:

void ffcdsp(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS TDISPn display format into the equivalent C format
  suitable for use in a printf statement.
*/
{
    int ii;

    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
    {
        cform[0] = '\0';
        return;    /* input format string was blank */
    }

    if (strchr(tform+ii, '%'))  /* is there a % character in the string?? */
    {
        cform[0] = '\0';
        return;    /* illegal TFORM string (possibly even harmful) */
    }

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[ii + 1]); /* append the width and decimal code */

    if      (tform[ii] == 'A' || tform[ii] == 'a')
        strcat(cform, "s");
    else if (tform[ii] == 'I' || tform[ii] == 'i')
        strcat(cform, "d");
    else if (tform[ii] == 'O' || tform[ii] == 'o')
        strcat(cform, "o");
    else if (tform[ii] == 'Z' || tform[ii] == 'z')
        strcat(cform, "X");
    else if (tform[ii] == 'F' || tform[ii] == 'f')
        strcat(cform, "f");
    else if (tform[ii] == 'E' || tform[ii] == 'e')
        strcat(cform, "E");
    else if (tform[ii] == 'D' || tform[ii] == 'd')
        strcat(cform, "E");
    else if (tform[ii] == 'G' || tform[ii] == 'g')
        strcat(cform, "G");
    else
        cform[0] = '\0';  /* unrecognized tform code */

    return;
}